

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

void gpu_free_error_queue(void)

{
  uint local_c;
  uint i;
  
  for (local_c = 0; local_c < _gpu_error_code_queue_size; local_c = local_c + 1) {
    SDL_free(_gpu_error_code_queue[local_c].function);
    _gpu_error_code_queue[local_c].function = (char *)0x0;
    SDL_free(_gpu_error_code_queue[local_c].details);
    _gpu_error_code_queue[local_c].details = (char *)0x0;
  }
  SDL_free(_gpu_error_code_queue);
  _gpu_error_code_queue = (GPU_ErrorObject *)0x0;
  _gpu_num_error_codes = 0;
  SDL_free(_gpu_error_code_result.function);
  _gpu_error_code_result.function = (char *)0x0;
  SDL_free(_gpu_error_code_result.details);
  _gpu_error_code_result.details = (char *)0x0;
  return;
}

Assistant:

void gpu_free_error_queue(void)
{
    unsigned int i;
    // Free the error queue
    for(i = 0; i < _gpu_error_code_queue_size; i++)
    {
        SDL_free(_gpu_error_code_queue[i].function);
        _gpu_error_code_queue[i].function = NULL;
        SDL_free(_gpu_error_code_queue[i].details);
        _gpu_error_code_queue[i].details = NULL;
    }
    SDL_free(_gpu_error_code_queue);
    _gpu_error_code_queue = NULL;
    _gpu_num_error_codes = 0;

    SDL_free(_gpu_error_code_result.function);
    _gpu_error_code_result.function = NULL;
    SDL_free(_gpu_error_code_result.details);
    _gpu_error_code_result.details = NULL;
}